

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

void __thiscall
helics::CoreBroker::processBrokerConfigureCommands(CoreBroker *this,ActionMessage *cmd)

{
  int iVar1;
  code *pcVar2;
  undefined8 *puVar3;
  string_view lfile;
  basic_string_view<char,_std::char_traits<char>_> __args_1;
  basic_string_view<char,_std::char_traits<char>_> __args_2;
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  callback;
  optional<std::any> locker;
  _Any_data local_98;
  code *local_88;
  undefined8 uStack_80;
  _Any_data local_78;
  code *local_68;
  undefined8 local_60;
  _Optional_payload_base<std::any> local_50;
  _Any_data local_38;
  code *local_28;
  undefined8 uStack_20;
  
  iVar1 = cmd->messageID;
  if (iVar1 < 0x250) {
    if ((iVar1 == 0x2f) || (iVar1 == 0x10f)) {
      BrokerBase::setLogLevel(&this->super_BrokerBase,(cmd->dest_handle).hid);
      return;
    }
  }
  else if (iVar1 == 0x250) {
    if ((short)cmd->flags < 0) {
      local_28 = (code *)0x0;
      uStack_20 = 0;
      local_38._M_unused._M_object = (void *)0x0;
      local_38._8_8_ = 0;
      BrokerBase::setLoggerFunction
                (&this->super_BrokerBase,
                 (function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                  *)&local_38);
      if (local_28 != (code *)0x0) {
        (*local_28)(&local_38,&local_38,__destroy_functor);
      }
    }
    else {
      gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>::try_unload
                ((optional<std::any> *)&local_50,(this->dataAirlocks)._M_elems + cmd->counter);
      if (local_50._M_engaged == true) {
        puVar3 = (undefined8 *)
                 std::
                 __any_caster<std::function<void(int,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>>
                           ((any *)&local_50);
        if (puVar3 == (undefined8 *)0x0) {
          std::__throw_bad_any_cast();
        }
        local_98._M_unused._M_object = (void *)0x0;
        local_98._8_8_ = 0;
        local_88 = (code *)0x0;
        uStack_80 = puVar3[3];
        pcVar2 = (code *)puVar3[2];
        if (pcVar2 != (code *)0x0) {
          local_98._M_unused._0_8_ = (undefined8)*puVar3;
          local_98._8_8_ = puVar3[1];
          puVar3[2] = 0;
          puVar3[3] = 0;
          local_88 = pcVar2;
        }
        __args_1._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
        __args_1._M_len = (this->super_BrokerBase).identifier._M_string_length;
        __args_2._M_str = "logging callback activated";
        __args_2._M_len = 0x1a;
        std::
        function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
        ::operator()((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                      *)&local_98,0,__args_1,__args_2);
        local_78._M_unused._M_object = (void *)0x0;
        local_78._8_8_ = 0;
        local_68 = (code *)0x0;
        local_60 = uStack_80;
        if (local_88 != (code *)0x0) {
          local_78._M_unused._M_object = local_98._M_unused._M_object;
          local_78._8_8_ = local_98._8_8_;
          local_68 = local_88;
          local_88 = (code *)0x0;
          uStack_80 = 0;
        }
        BrokerBase::setLoggerFunction
                  (&this->super_BrokerBase,
                   (function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                    *)&local_78);
        if (local_68 != (code *)0x0) {
          (*local_68)(&local_78,&local_78,__destroy_functor);
        }
        if (local_88 != (code *)0x0) {
          (*local_88)((_Any_data *)&local_98,(_Any_data *)&local_98,__destroy_functor);
        }
      }
      if (local_50._M_engaged == true) {
        std::_Optional_payload_base<std::any>::_M_destroy(&local_50);
      }
    }
  }
  else {
    if (iVar1 == 0x252) {
      lfile._M_str = (char *)(cmd->payload).heap;
      lfile._M_len = (cmd->payload).bufferSize;
      BrokerBase::setLoggingFile(&this->super_BrokerBase,lfile);
      return;
    }
    if ((iVar1 == 0x25f) && ((cmd->flags & 0x20) != 0)) {
      BrokerBase::setTickForwarding(&this->super_BrokerBase,PING_RESPONSE,true);
      return;
    }
  }
  return;
}

Assistant:

void CoreBroker::processBrokerConfigureCommands(ActionMessage& cmd)
{
    switch (cmd.messageID) {
        case defs::Flags::ENABLE_INIT_ENTRY:
            /*if (delayInitCounter <= 1)
        {
            delayInitCounter = 0;
            if (allInitReady())
            {
                BrokerState exp = CONNECTED;
                if (brokerState.compare_exchange_strong(exp, BrokerState::INITIALIZING))
                {  // make sure we only do this once
                    checkDependencies();
                    cmd.setAction(CMD_INIT);
                    cmd.source_id = global_broker_id_local;
                    cmd.dest_id = 0;
                    transmit(0, cmd);
                }
            }
        }
        else
        {
            --delayInitCounter;
        }
        break;
        */
        case defs::Properties::LOG_LEVEL:
            setLogLevel(cmd.getExtraData());
            break;
        case UPDATE_LOGGING_CALLBACK:
            if (checkActionFlag(cmd, empty_flag)) {
                setLoggerFunction(nullptr);
            } else {
                auto locker = dataAirlocks[cmd.counter].try_unload();
                if (locker) {
                    try {
                        auto callback = std::any_cast<
                            std::function<void(int, std::string_view, std::string_view)>>(
                            std::move(*locker));
                        callback(0, identifier, "logging callback activated");
                        setLoggerFunction(std::move(callback));
                    }
                    catch (const std::bad_any_cast&) {
                        // This shouldn't really happen unless someone is being malicious so just
                        // ignore it for now.
                        ;
                    }
                }
            }
            break;
        case UPDATE_LOGGING_FILE:
            setLoggingFile(cmd.payload.to_string());
            break;
        case REQUEST_TICK_FORWARDING:
            if (checkActionFlag(cmd, indicator_flag)) {
                setTickForwarding(TickForwardingReasons::PING_RESPONSE, true);
            }
            break;
        default:
            break;
    }
}